

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O0

Constraint *
create_not_equal_to_contents_constraint
          (void *pointer_to_compare,size_t size_to_compare,char *compared_pointer_name)

{
  CgreenValue expected_value;
  Constraint *pCVar1;
  size_t in_RSI;
  void *in_RDI;
  Constraint *constraint;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  anon_union_8_4_d526cc82_for_value in_stack_ffffffffffffffd0;
  
  make_cgreen_pointer_value((CgreenValue *)&stack0xffffffffffffffc8,in_RDI);
  expected_value.value = (anon_union_8_4_d526cc82_for_value)in_stack_ffffffffffffffc8;
  expected_value._0_8_ = in_stack_ffffffffffffffc0;
  expected_value.value_size = in_stack_ffffffffffffffd0.integer_value;
  pCVar1 = create_constraint_expecting(expected_value,in_stack_ffffffffffffffd0.string_value);
  pCVar1->type = CGREEN_CONTENT_COMPARER_CONSTRAINT;
  pCVar1->compare = compare_do_not_want_contents;
  pCVar1->execute = test_want;
  pCVar1->name = "not equal contents of";
  pCVar1->size_of_expected_value = in_RSI;
  return pCVar1;
}

Assistant:

Constraint *create_not_equal_to_contents_constraint(void *pointer_to_compare, size_t size_to_compare, const char *compared_pointer_name) {
    Constraint *constraint = create_constraint_expecting(make_cgreen_pointer_value(pointer_to_compare), compared_pointer_name);
    constraint->type = CGREEN_CONTENT_COMPARER_CONSTRAINT;

    constraint->compare = &compare_do_not_want_contents;
    constraint->execute = &test_want;
    constraint->name = "not equal contents of";
    constraint->size_of_expected_value = size_to_compare;

    return constraint;
}